

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O2

char * __thiscall leveldb::VersionSet::LevelSummary(VersionSet *this,LevelSummaryStorage *scratch)

{
  Version *pVVar1;
  long in_FS_OFFSET;
  
  pVVar1 = this->current_;
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    snprintf(scratch->buffer,100,"files[ %d %d %d %d %d %d %d ]",
             (ulong)((long)pVVar1->files_[0].
                           super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)pVVar1->files_[0].
                          super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                          ._M_impl.super__Vector_impl_data._M_start) >> 3,
             (ulong)((long)pVVar1->files_[1].
                           super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)pVVar1->files_[1].
                          super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                          ._M_impl.super__Vector_impl_data._M_start) >> 3,
             (ulong)((long)pVVar1->files_[2].
                           super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)pVVar1->files_[2].
                          super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                          ._M_impl.super__Vector_impl_data._M_start) >> 3,
             (ulong)((long)pVVar1->files_[3].
                           super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)pVVar1->files_[3].
                          super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                          ._M_impl.super__Vector_impl_data._M_start) >> 3,
             (ulong)((long)pVVar1->files_[4].
                           super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)pVVar1->files_[4].
                          super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                          ._M_impl.super__Vector_impl_data._M_start) >> 3,
             (ulong)((long)pVVar1->files_[5].
                           super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)pVVar1->files_[5].
                          super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                          ._M_impl.super__Vector_impl_data._M_start) >> 3,
             (ulong)((long)pVVar1->files_[6].
                           super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)pVVar1->files_[6].
                          super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                          ._M_impl.super__Vector_impl_data._M_start) >> 3);
    return scratch->buffer;
  }
  __stack_chk_fail();
}

Assistant:

const char* VersionSet::LevelSummary(LevelSummaryStorage* scratch) const {
  // Update code if kNumLevels changes
  static_assert(config::kNumLevels == 7, "");
  snprintf(scratch->buffer, sizeof(scratch->buffer),
           "files[ %d %d %d %d %d %d %d ]", int(current_->files_[0].size()),
           int(current_->files_[1].size()), int(current_->files_[2].size()),
           int(current_->files_[3].size()), int(current_->files_[4].size()),
           int(current_->files_[5].size()), int(current_->files_[6].size()));
  return scratch->buffer;
}